

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing-utils.c
# Opt level: O0

_Bool str_to_bool(char *string,_Bool *out)

{
  int iVar1;
  _Bool *out_local;
  char *string_local;
  
  iVar1 = strcasecmp(string,"true");
  if ((iVar1 == 0) || (iVar1 = strcmp(string,"1"), iVar1 == 0)) {
    *out = true;
    return true;
  }
  iVar1 = strcasecmp(string,"false");
  if ((iVar1 != 0) && (iVar1 = strcmp(string,"0"), iVar1 != 0)) {
    return false;
  }
  *out = false;
  return true;
}

Assistant:

bool str_to_bool(const char *string, bool *out) {
    if ((0 == strcasecmp(string, "true")) || (0 == strcmp(string, "1"))) {
        *out = true;
        return true;
    } else if (0 == strcasecmp(string, "false") || (0 == strcmp(string, "0"))) {
        *out = false;
        return true;
    }

    return false;
}